

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O0

double Js::JavascriptNumber::DirectPowDoubleInt(double x,int32 y)

{
  undefined8 local_38;
  undefined4 local_2c;
  undefined8 local_28;
  double result;
  uint32 uexp;
  int32 y_local;
  double x_local;
  
  if ((y < -8) || (8 < y)) {
    x_local = pow(x,(double)y);
  }
  else {
    local_2c = y;
    if (y < 0) {
      local_2c = -y;
    }
    result._0_4_ = local_2c;
    local_28 = 1.0;
    _uexp = x;
    while( true ) {
      if ((result._0_4_ & 1) != 0) {
        local_28 = _uexp * local_28;
      }
      result._0_4_ = result._0_4_ >> 1;
      if (result._0_4_ == 0) break;
      _uexp = _uexp * _uexp;
    }
    if (y < 0) {
      local_38 = 1.0 / local_28;
    }
    else {
      local_38 = local_28;
    }
    x_local = local_38;
  }
  return x_local;
}

Assistant:

double JavascriptNumber::DirectPowDoubleInt(double x, int32 y)
    {
        // For exponent in [-8, 8], aggregate the product according to binary representation
        // of exponent. This acceleration may lead to significant deviation for larger exponent
        if (y >= -8 && y <= 8)
        {
            uint32 uexp = static_cast<uint32>(y >= 0 ? y : -y);
            for (double result = 1.0; ; x *= x)
            {
                if ((uexp & 1) != 0)
                {
                    result *= x;
                }
                if ((uexp >>= 1) == 0)
                {
                    return (y < 0 ? (1.0 / result) : result);
                }
            }
        }

        // always call pow(double, double) in C runtime which has a bug to process pow(double, int).
        return ::pow(x, static_cast<double>(y));
    }